

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

void __thiscall
argvParser::argvParser
          (argvParser *this,string *applicationNam_,string *description_,bool addDefaultHelpCommand_
          ,string *commentToken_)

{
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  *this_00;
  section *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  argParserAdvancedConfiguration::argParserAdvancedConfiguration
            (&this->super_argParserAdvancedConfiguration);
  (this->commentToken)._M_dataplus._M_p = (pointer)&(this->commentToken).field_2;
  (this->commentToken)._M_string_length = 0;
  (this->commentToken).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  this->analyseArgvNotJetRun = true;
  (this->nameOfDefaultConfigFile)._M_dataplus._M_p =
       (pointer)&(this->nameOfDefaultConfigFile).field_2;
  (this->nameOfDefaultConfigFile)._M_string_length = 0;
  (this->nameOfDefaultConfigFile).field_2._M_local_buf[0] = '\0';
  (this->defaultConfigFilesLocations)._M_dataplus._M_p =
       (pointer)&(this->defaultConfigFilesLocations).field_2;
  (this->defaultConfigFilesLocations)._M_string_length = 0;
  (this->defaultConfigFilesLocations).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_argParserAdvancedConfiguration).applicationName);
  std::operator+(&local_50,description_,"\n");
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->addHelp = addDefaultHelpCommand_;
  std::__cxx11::string::_M_assign((string *)&this->commentToken);
  this_00 = (vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
             *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  (this->super_argParserAdvancedConfiguration).newargconfig =
       (vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
        *)this_00;
  this_01 = (section *)operator_new(0x28);
  (this_01->sectionName).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_01->sectionName).field_2 + 8) = 0;
  (this_01->sectionName)._M_dataplus._M_p = (pointer)0x0;
  (this_01->sectionName)._M_string_length = 0;
  this_01->arguments =
       (vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
        *)0x0;
  argParserAdvancedConfiguration::section::section(this_01);
  local_50._M_dataplus._M_p = (pointer)this_01;
  std::
  vector<argParserAdvancedConfiguration::section*,std::allocator<argParserAdvancedConfiguration::section*>>
  ::emplace_back<argParserAdvancedConfiguration::section*>(this_00,(section **)&local_50);
  return;
}

Assistant:

argvParser::argvParser(string applicationNam_, string description_, bool addDefaultHelpCommand_, string commentToken_) {
    applicationName = applicationNam_;
    description = description_ + "\n";
    addHelp = addDefaultHelpCommand_;
    commentToken = commentToken_;
    newargconfig = new vector<section*>();
    newargconfig->push_back(new section());
}